

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O3

bool LoadScriptFile(char *name,bool include,int type)

{
  bool bVar1;
  int lump;
  int numnodes;
  FWadLump *lump_00;
  
  bVar1 = false;
  lump = FWadCollection::CheckNumForName(&Wads,name,0);
  if (-1 < lump) {
    lump_00 = FWadCollection::ReopenLumpNum(&Wads,lump);
    numnodes = FWadCollection::LumpLength(&Wads,lump);
    bVar1 = LoadScriptFile(lump,&lump_00->super_FileReader,numnodes,include,type);
    if (lump_00 != (FWadLump *)0x0) {
      (*(lump_00->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[1])(lump_00);
    }
  }
  return bVar1;
}

Assistant:

bool LoadScriptFile (const char *name, bool include, int type)
{
	int lumpnum = Wads.CheckNumForName (name);
	FileReader *lump;

	if (lumpnum < 0)
	{
		return false;
	}
	lump = Wads.ReopenLumpNum (lumpnum);

	bool res = LoadScriptFile(lumpnum, lump, Wads.LumpLength(lumpnum), include, type);
	delete lump;
	return res;
}